

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidget.cpp
# Opt level: O2

QStringList * __thiscall
QAccessibleWidget::actionNames(QStringList *__return_storage_ptr__,QAccessibleWidget *this)

{
  FocusPolicy FVar1;
  QWidget *pQVar2;
  QString *args;
  
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  (__return_storage_ptr__->d).size = 0;
  pQVar2 = widget(this);
  if ((pQVar2->data->widget_attributes & 1) == 0) {
    pQVar2 = widget(this);
    FVar1 = QWidget::focusPolicy(pQVar2);
    if (FVar1 != NoFocus) {
      args = (QString *)QAccessibleActionInterface::setFocusAction();
      QList<QString>::emplaceBack<QString_const&>(__return_storage_ptr__,args);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QStringList QAccessibleWidget::actionNames() const
{
    QStringList names;
    if (widget()->isEnabled()) {
        if (widget()->focusPolicy() != Qt::NoFocus)
            names << setFocusAction();
    }
    return names;
}